

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O0

SQRESULT declare_stream(HSQUIRRELVM v,SQChar *name,SQUserPointer typetag,SQChar *reg_name,
                       SQRegFunction *methods,SQRegFunction *globals)

{
  SQObjectType SVar1;
  SQInteger newtop;
  SQRESULT SVar2;
  SQRegFunction *pSVar3;
  SQRegFunction *f_1;
  SQRegFunction *f;
  SQInteger i;
  SQInteger top;
  SQRegFunction *globals_local;
  SQRegFunction *methods_local;
  SQChar *reg_name_local;
  SQUserPointer typetag_local;
  SQChar *name_local;
  HSQUIRRELVM v_local;
  
  SVar1 = sq_gettype(v,-1);
  if (SVar1 == OT_TABLE) {
    newtop = sq_gettop(v);
    init_streamclass(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,reg_name,-1);
    sq_pushstring(v,"std_stream",-1);
    SVar2 = sq_get(v,-3);
    if (SVar2 < 0) {
      sq_settop(v,newtop);
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
    else {
      sq_newclass(v,1);
      sq_settypetag(v,-1,typetag);
      for (f = (SQRegFunction *)0x0; methods[(long)f].name != (SQChar *)0x0;
          f = (SQRegFunction *)((long)&f->name + 1)) {
        pSVar3 = methods + (long)f;
        sq_pushstring(v,pSVar3->name,-1);
        sq_newclosure(v,pSVar3->f,0);
        sq_setparamscheck(v,pSVar3->nparamscheck,pSVar3->typemask);
        sq_setnativeclosurename(v,-1,pSVar3->name);
        sq_newslot(v,-3,0);
      }
      sq_newslot(v,-3,0);
      sq_pop(v,1);
      for (f = (SQRegFunction *)0x0; globals[(long)f].name != (SQChar *)0x0;
          f = (SQRegFunction *)((long)&f->name + 1)) {
        pSVar3 = globals + (long)f;
        sq_pushstring(v,pSVar3->name,-1);
        sq_newclosure(v,pSVar3->f,0);
        sq_setparamscheck(v,pSVar3->nparamscheck,pSVar3->typemask);
        sq_setnativeclosurename(v,-1,pSVar3->name);
        sq_newslot(v,-3,0);
      }
      sq_pushstring(v,name,-1);
      sq_pushregistrytable(v);
      sq_pushstring(v,reg_name,-1);
      sq_get(v,-2);
      sq_remove(v,-2);
      sq_newslot(v,-3,0);
      sq_settop(v,newtop);
      v_local = (HSQUIRRELVM)0x0;
    }
  }
  else {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"table expected");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT declare_stream(HSQUIRRELVM v,const SQChar* name,SQUserPointer typetag,const SQChar* reg_name,const SQRegFunction *methods,const SQRegFunction *globals)
{
    if(sq_gettype(v,-1) != OT_TABLE)
        return sq_throwerror(v,_SC("table expected"));
    SQInteger top = sq_gettop(v);
    //create delegate
    init_streamclass(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,reg_name,-1);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-3))) {
        sq_newclass(v,SQTrue);
        sq_settypetag(v,-1,typetag);
        SQInteger i = 0;
        while(methods[i].name != 0) {
            const SQRegFunction &f = methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);

        i = 0;
        while(globals[i].name!=0)
        {
            const SQRegFunction &f = globals[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        //register the class in the target table
        sq_pushstring(v,name,-1);
        sq_pushregistrytable(v);
        sq_pushstring(v,reg_name,-1);
        sq_get(v,-2);
        sq_remove(v,-2);
        sq_newslot(v,-3,SQFalse);

        sq_settop(v,top);
        return SQ_OK;
    }
    sq_settop(v,top);
    return SQ_ERROR;
}